

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O2

void __thiscall
sjtu::FileManager<sjtu::userType>::save(FileManager<sjtu::userType> *this,locType *offset)

{
  LRUCache<sjtu::userType>::dirty_page_set
            ((this->super_FileManager_Base<sjtu::userType>).cache,offset);
  return;
}

Assistant:

virtual void save(const locType &offset) override {cache -> dirty_page_set(offset);}